

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O0

aiMesh * __thiscall
Assimp::IRRImporter::BuildSingleQuadMesh
          (IRRImporter *this,SkyboxVertex *v1,SkyboxVertex *v2,SkyboxVertex *v3,SkyboxVertex *v4)

{
  aiFace *paVar1;
  float fVar2;
  aiMesh *this_00;
  undefined8 *puVar3;
  uint *puVar4;
  aiVector3D *paVar5;
  aiVector3t<float> *local_c0;
  aiVector3t<float> *local_a0;
  aiVector3t<float> *local_80;
  aiFace *local_58;
  aiVector3D *vec;
  uint i;
  aiFace *face;
  aiMesh *out;
  SkyboxVertex *v4_local;
  SkyboxVertex *v3_local;
  SkyboxVertex *v2_local;
  SkyboxVertex *v1_local;
  IRRImporter *this_local;
  
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  this_00->mPrimitiveTypes = 8;
  this_00->mNumFaces = 1;
  puVar3 = (undefined8 *)operator_new__(0x18);
  *puVar3 = 1;
  local_58 = (aiFace *)(puVar3 + 1);
  do {
    aiFace::aiFace(local_58);
    local_58 = local_58 + 1;
  } while (local_58 != (aiFace *)(puVar3 + 3));
  this_00->mFaces = (aiFace *)(puVar3 + 1);
  paVar1 = this_00->mFaces;
  paVar1->mNumIndices = 4;
  puVar4 = (uint *)operator_new__(0x10);
  paVar1->mIndices = puVar4;
  for (vec._4_4_ = 0; vec._4_4_ < 4; vec._4_4_ = vec._4_4_ + 1) {
    paVar1->mIndices[vec._4_4_] = vec._4_4_;
  }
  this_00->mNumVertices = 4;
  paVar5 = (aiVector3D *)operator_new__(0x30);
  local_80 = paVar5;
  do {
    aiVector3t<float>::aiVector3t(local_80);
    local_80 = local_80 + 1;
  } while (local_80 != paVar5 + 4);
  this_00->mVertices = paVar5;
  fVar2 = (v1->position).y;
  paVar5->x = (v1->position).x;
  paVar5->y = fVar2;
  paVar5->z = (v1->position).z;
  fVar2 = (v2->position).y;
  paVar5[1].x = (v2->position).x;
  paVar5[1].y = fVar2;
  paVar5[1].z = (v2->position).z;
  fVar2 = (v3->position).y;
  paVar5[2].x = (v3->position).x;
  paVar5[2].y = fVar2;
  paVar5[2].z = (v3->position).z;
  fVar2 = (v4->position).y;
  paVar5[3].x = (v4->position).x;
  paVar5[3].y = fVar2;
  paVar5[3].z = (v4->position).z;
  paVar5 = (aiVector3D *)operator_new__(0x30);
  local_a0 = paVar5;
  do {
    aiVector3t<float>::aiVector3t(local_a0);
    local_a0 = local_a0 + 1;
  } while (local_a0 != paVar5 + 4);
  this_00->mNormals = paVar5;
  fVar2 = (v1->normal).y;
  paVar5->x = (v1->normal).x;
  paVar5->y = fVar2;
  paVar5->z = (v1->normal).z;
  fVar2 = (v2->normal).y;
  paVar5[1].x = (v2->normal).x;
  paVar5[1].y = fVar2;
  paVar5[1].z = (v2->normal).z;
  fVar2 = (v3->normal).y;
  paVar5[2].x = (v3->normal).x;
  paVar5[2].y = fVar2;
  paVar5[2].z = (v3->normal).z;
  fVar2 = (v4->normal).y;
  paVar5[3].x = (v4->normal).x;
  paVar5[3].y = fVar2;
  paVar5[3].z = (v4->normal).z;
  paVar5 = (aiVector3D *)operator_new__(0x30);
  local_c0 = paVar5;
  do {
    aiVector3t<float>::aiVector3t(local_c0);
    local_c0 = local_c0 + 1;
  } while (local_c0 != paVar5 + 4);
  this_00->mTextureCoords[0] = paVar5;
  fVar2 = (v1->uv).y;
  paVar5->x = (v1->uv).x;
  paVar5->y = fVar2;
  paVar5->z = (v1->uv).z;
  fVar2 = (v2->uv).y;
  paVar5[1].x = (v2->uv).x;
  paVar5[1].y = fVar2;
  paVar5[1].z = (v2->uv).z;
  fVar2 = (v3->uv).y;
  paVar5[2].x = (v3->uv).x;
  paVar5[2].y = fVar2;
  paVar5[2].z = (v3->uv).z;
  fVar2 = (v4->uv).y;
  paVar5[3].x = (v4->uv).x;
  paVar5[3].y = fVar2;
  paVar5[3].z = (v4->uv).z;
  return this_00;
}

Assistant:

aiMesh* IRRImporter::BuildSingleQuadMesh(const SkyboxVertex& v1,
    const SkyboxVertex& v2,
    const SkyboxVertex& v3,
    const SkyboxVertex& v4)
{
    // allocate and prepare the mesh
    aiMesh* out = new aiMesh();

    out->mPrimitiveTypes = aiPrimitiveType_POLYGON;
    out->mNumFaces = 1;

    // build the face
    out->mFaces    = new aiFace[1];
    aiFace& face   = out->mFaces[0];

    face.mNumIndices = 4;
    face.mIndices    = new unsigned int[4];
    for (unsigned int i = 0; i < 4;++i)
        face.mIndices[i] = i;

    out->mNumVertices = 4;

    // copy vertex positions
    aiVector3D* vec = out->mVertices = new aiVector3D[4];
    *vec++ = v1.position;
    *vec++ = v2.position;
    *vec++ = v3.position;
    *vec   = v4.position;

    // copy vertex normals
    vec = out->mNormals = new aiVector3D[4];
    *vec++ = v1.normal;
    *vec++ = v2.normal;
    *vec++ = v3.normal;
    *vec   = v4.normal;

    // copy texture coordinates
    vec = out->mTextureCoords[0] = new aiVector3D[4];
    *vec++ = v1.uv;
    *vec++ = v2.uv;
    *vec++ = v3.uv;
    *vec   = v4.uv;
    return out;
}